

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::continueCidr(Lexer *this,size_t range)

{
  Report *pRVar1;
  int iVar2;
  Token TVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  nextChar(this,true);
  iVar2 = this->currentChar_;
  if (iVar2 - 0x30U < 10) {
    this->numberValue_ = 0;
    while( true ) {
      if (9 < iVar2 - 0x30U) break;
      this->numberValue_ = (ulong)(iVar2 - 0x30U) + this->numberValue_ * 10;
      std::__cxx11::string::push_back((char)this + -0x58);
      nextChar(this,true);
      iVar2 = this->currentChar_;
    }
    if (this->numberValue_ <= (long)range) {
      TVar3 = Cidr;
      goto LAB_0012e7ec;
    }
    pRVar1 = this->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"{}[{}:{}]: CIDR prefix out of range.",&local_81);
    std::__cxx11::string::string((string *)&local_60,(string *)&this->location_);
    diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long>
              (pRVar1,&this->lastLocation_,&local_80,&local_60,(ulong)(this->location_).end.line,
               (ulong)(this->location_).end.column);
    this_00 = &local_60;
  }
  else {
    pRVar1 = this->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"{}[{}:{}]: invalid byte {}",&local_81);
    std::__cxx11::string::string((string *)&local_40,(string *)&this->location_);
    diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
              (pRVar1,&this->lastLocation_,&local_80,&local_40,(ulong)(this->location_).end.line,
               (ulong)(this->location_).end.column,(uint)(byte)this->currentChar_);
    this_00 = &local_40;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_80);
  TVar3 = Unknown;
LAB_0012e7ec:
  this->token_ = TVar3;
  return TVar3;
}

Assistant:

Token Lexer::continueCidr(size_t range) {
  // IPv6 CIDR
  nextChar();  // consume '/'

  if (!std::isdigit(currentChar())) {
    report_.tokenError(lastLocation(),
        "{}[{}:{}]: invalid byte {}",
        location_.filename,
        line(),
        column(),
        (int)(currentChar() & 0xFF));
    return token_ = Token::Unknown;
  }

  numberValue_ = 0;
  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (numberValue_ > static_cast<decltype(numberValue_)>(range)) {
    report_.tokenError(lastLocation(),
                       "{}[{}:{}]: CIDR prefix out of range.",
                       location_.filename, line(), column());
    return token_ = Token::Unknown;
  }

  return token_ = Token::Cidr;
}